

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmatrix.h
# Opt level: O3

basic_istream<char,_std::char_traits<char>_> *
gmath::operator>>(basic_istream<char,_std::char_traits<char>_> *in,DMatrix<double> *a)

{
  int iVar1;
  iterator __position;
  pointer pdVar2;
  long lVar3;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  char c;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  elem;
  double v;
  char local_69;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_68;
  double local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  local_68.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator>>(in,&local_69);
  if (local_69 == '[') {
    do {
      lVar3 = *(long *)(*(long *)in + -0x18);
      if (((byte)in[lVar3 + 0x20] & 5) != 0) goto LAB_001608c2;
      std::operator>>(in,&local_69);
      if (local_69 != ';') {
        if (local_69 == ']') break;
        std::istream::putback((char)in);
      }
      local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
      ::emplace_back<std::vector<double,std::allocator<double>>>
                ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                  *)&local_68,&local_48);
      if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      while (((local_69 != ';' && (local_69 != ']')) &&
             (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) == 0))) {
        std::operator>>(in,&local_69);
        if ((local_69 != ';') && (local_69 != ']')) {
          std::istream::putback((char)in);
          std::istream::_M_extract<double>((double *)in);
          __position._M_current =
               local_68.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_finish;
          if (__position._M_current ==
              local_68.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)
                       (local_68.
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1),__position,&local_50);
          }
          else {
            *__position._M_current = local_50;
            local_68.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_finish = __position._M_current + 1;
          }
        }
      }
      if (((*(uint *)(in + *(long *)(*(long *)in + -0x18) + 0x20) & 5) == 0) &&
         ((long)((local_68.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
                ._M_finish -
          (long)((local_68.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
                ._M_start !=
          (long)local_68.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)local_68.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start)) {
        std::ios::clear((int)*(long *)(*(long *)in + -0x18) + (int)in);
      }
    } while (local_69 != ']');
    lVar3 = *(long *)(*(long *)in + -0x18);
LAB_001608c2:
    if (((byte)in[lVar3 + 0x20] & 5) == 0) {
      uVar8 = ((long)local_68.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_68.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      uVar7 = (uint)uVar8;
      if ((int)uVar7 < 1) {
        uVar6 = 0;
      }
      else {
        uVar6 = (ulong)((long)((local_68.
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)((local_68.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 3;
      }
      DMatrix<double>::init(a,(EVP_PKEY_CTX *)(uVar8 & 0xffffffff));
      if (0 < (int)uVar7) {
        pdVar4 = a->v;
        iVar1 = a->ncols;
        uVar8 = 0;
        do {
          if (0 < (int)uVar6) {
            pdVar2 = local_68.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar8].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar5 = 0;
            do {
              pdVar4[uVar5] = pdVar2[uVar5];
              uVar5 = uVar5 + 1;
            } while ((uVar6 & 0xffffffff) != uVar5);
          }
          uVar8 = uVar8 + 1;
          pdVar4 = pdVar4 + iVar1;
        } while (uVar8 != (uVar7 & 0x7fffffff));
      }
    }
  }
  else {
    std::ios::clear((int)in + (int)*(undefined8 *)(*(long *)in + -0x18));
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_68);
  return in;
}

Assistant:

std::basic_istream<Ch, Tr> &operator>>(std::basic_istream<Ch, Tr> &in, DMatrix<T> &a)
{
  T    v;
  std::vector<std::vector<T> > elem;
  char c;

  in >> c;

  if (c == '[')
  {
    while (c != ']' && in)
    {
      in >> c;

      if (c != ']')
      {
        if (c != ';')
        {
          in.putback(c);
        }

        elem.push_back(std::vector<T>());

        while (c != ';' && c != ']' && in)
        {
          in >> c;

          if (c != ';' && c != ']')
          {
            in.putback(c);

            in >> v;
            elem.back().push_back(v);
          }
        }

        if (in && elem.front().size() != elem.back().size())
        {
          in.setstate(std::ios_base::failbit);
        }
      }
    }

    if (in)
    {
      int rows=static_cast<int>(elem.size());
      int cols=0;

      if (rows > 0)
      {
        cols=static_cast<int>(elem.front().size());
      }

      a.init(rows, cols);

      for (int k=0; k<rows; k++)
        for (int i=0; i<cols; i++)
        {
          a(k, i)=elem[k][i];
        }
    }
  }
  else
  {
    in.setstate(std::ios_base::failbit);
  }

  return in;
}